

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

void __thiscall cfd::core::Serializer::CheckNeedSize(Serializer *this,uint32_t need_size)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  
  puVar3 = (pointer)(ulong)need_size;
  puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish + (-(ulong)this->offset_ - (long)puVar1) < puVar3) {
    puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (puVar2 + (-(ulong)this->offset_ - (long)puVar1) < (pointer)((long)puVar3 * 2)) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&this->buffer_,(size_type)(puVar2 + ((long)puVar3 * 10 - (long)puVar1)));
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->buffer_,
               (size_type)
               ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
               ((long)puVar3 * 2 -
               (long)(this->buffer_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start)));
    return;
  }
  return;
}

Assistant:

void Serializer::CheckNeedSize(uint32_t need_size) {
  size_t check_need_size = need_size;
  size_t size = buffer_.size() - static_cast<size_t>(offset_);
  if (size < need_size) {
    size_t cap = buffer_.capacity() - static_cast<size_t>(offset_);
    if (cap < (check_need_size * 2)) {
      buffer_.reserve(buffer_.capacity() + (check_need_size * 10));
    }
    buffer_.resize(buffer_.size() + (check_need_size * 2));
  }
}